

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position.cpp
# Opt level: O0

float __thiscall indk::Position::getDistanceFrom(Position *this,Position *P)

{
  uint uVar1;
  uint uVar2;
  Error *this_00;
  float fVar3;
  float fVar4;
  double dVar5;
  uint local_30;
  uint i;
  float CValue;
  float D;
  Position *P_local;
  Position *this_local;
  
  uVar1 = this->DimensionsCount;
  uVar2 = getDimensionsCount(P);
  if (uVar1 != uVar2) {
    this_00 = (Error *)__cxa_allocate_exception(0x28);
    Error::Error(this_00,10);
    __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
  }
  i = 0;
  for (local_30 = 0; local_30 < this->DimensionsCount; local_30 = local_30 + 1) {
    fVar4 = this->X[local_30];
    fVar3 = getPositionValue(P,local_30);
    fVar4 = fVar4 - fVar3;
    i = (uint)(fVar4 * fVar4 + (float)i);
  }
  dVar5 = sqrt((double)(float)i);
  return (float)dVar5;
}

Assistant:

float indk::Position::getDistanceFrom(const indk::Position *P) {
    if (DimensionsCount != P->getDimensionsCount()) {
        throw indk::Error(indk::Error::EX_POSITION_DIMENSIONS);
    }
    float D = 0, CValue;
    for (unsigned int i = 0; i < DimensionsCount; i++) {
        CValue = X[i] - P -> getPositionValue(i);
        D += CValue * CValue;
    }
    return sqrt(D);
}